

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocket.hpp
# Opt level: O2

void __thiscall
webfront::websocket::WebSocket<webfront::networking::TCPNetworkingTS>::writeData
          (WebSocket<webfront::networking::TCPNetworkingTS> *this,
          Frame<webfront::networking::TCPNetworkingTS> *frame)

{
  completion_handler_type local_30;
  _Vector_base<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
  local_28;
  
  http::std::
  vector<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
  ::vector((vector<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
            *)&local_28,&frame->buffers);
  local_30.this = this;
  networking::TCPNetworkingTS::
  AsyncWrite<std::experimental::net::v1::basic_stream_socket<std::experimental::net::v1::ip::tcp>&,std::vector<std::experimental::net::v1::const_buffer,std::allocator<std::experimental::net::v1::const_buffer>>,webfront::websocket::WebSocket<webfront::networking::TCPNetworkingTS>::writeData(webfront::websocket::Frame<webfront::networking::TCPNetworkingTS>)::_lambda(std::error_code,unsigned_long)_1_>
            (&this->socket,
             (vector<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
              *)&local_28,&local_30);
  http::std::
  _Vector_base<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
  ::~_Vector_base(&local_28);
  return;
}

Assistant:

void writeData(Frame<Net> frame) {
        Net::AsyncWrite(socket, frame.toBuffers(), [this](std::error_code ec, std::size_t /*bytesTransferred*/) {
            if (ec) {
                if (started) {
                    log::error("Error during write : ec.value() = {}", ec.value());
                    if (closeHandler) closeHandler(CloseEvent{static_cast<uint16_t>(ec.value()), ec.message()});
                    if (ec != Net::Error::OperationAborted) stop();
                }
            }
        });
    }